

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::~TSMuxer(TSMuxer *this)

{
  if (this->m_outBuf != (uint8_t *)0x0) {
    operator_delete__(this->m_outBuf);
  }
  if ((this->m_isExternalFile == false) && (this->m_muxFile != (AbstractOutputStream *)0x0)) {
    (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[1])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_fileNames);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&(this->m_priorityData).
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->m_interleaveInfo);
  std::__cxx11::string::~string((string *)&this->m_outFileName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_muxedPacketCnt).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->m_pesData);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_char>,_std::_Select1st<std::pair<const_int,_unsigned_char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>
  ::~_Rb_tree(&(this->m_pesType)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->m_pat).pmtPids._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&(this->m_pmt).pidList._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_TSMuxer::StreamInfo>,_std::_Select1st<std::pair<const_int,_TSMuxer::StreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  ::~_Rb_tree(&(this->m_streamInfo)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->m_extIndexToTSIndex)._M_t);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>);
  std::
  _Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>::
  ~_Vector_base(&(this->m_m2tsDelayBlocks).
                 super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
               );
  AbstractMuxer::~AbstractMuxer(&this->super_AbstractMuxer);
  return;
}

Assistant:

TSMuxer::~TSMuxer()
{
    delete[] m_outBuf;
    if (!m_isExternalFile)
        delete m_muxFile;
}